

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImGuiKeyRoutingTable::Clear(ImGuiKeyRoutingTable *this)

{
  int *piVar1;
  ImGuiKeyRoutingData *pIVar2;
  
  memset(this,0xff,0x118);
  pIVar2 = (this->Entries).Data;
  if (pIVar2 != (ImGuiKeyRoutingData *)0x0) {
    (this->Entries).Size = 0;
    (this->Entries).Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    (this->Entries).Data = (ImGuiKeyRoutingData *)0x0;
  }
  pIVar2 = (this->EntriesNext).Data;
  if (pIVar2 != (ImGuiKeyRoutingData *)0x0) {
    (this->EntriesNext).Size = 0;
    (this->EntriesNext).Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    (this->EntriesNext).Data = (ImGuiKeyRoutingData *)0x0;
  }
  return;
}

Assistant:

void Clear()                    { for (int n = 0; n < IM_ARRAYSIZE(Index); n++) Index[n] = -1; Entries.clear(); EntriesNext.clear(); }